

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand_unix.c
# Opt level: O0

int check_random_device(random_device *rd)

{
  int iVar1;
  int *in_RDI;
  stat st;
  bool local_99;
  stat local_98;
  int *local_8;
  
  local_99 = false;
  if (*in_RDI != -1) {
    local_8 = in_RDI;
    iVar1 = fstat(*in_RDI,&local_98);
    local_99 = false;
    if ((((iVar1 != -1) && (local_99 = false, *(__dev_t *)(local_8 + 2) == local_98.st_dev)) &&
        (local_99 = false, *(__ino_t *)(local_8 + 4) == local_98.st_ino)) &&
       (local_99 = false, ((local_8[6] ^ local_98.st_mode) & 0xfffffe00) == 0)) {
      local_99 = *(__dev_t *)(local_8 + 8) == local_98.st_rdev;
    }
  }
  return (int)local_99;
}

Assistant:

static int check_random_device(struct random_device * rd)
{
    struct stat st;

    return rd->fd != -1
           && fstat(rd->fd, &st) != -1
           && rd->dev == st.st_dev
           && rd->ino == st.st_ino
           && ((rd->mode ^ st.st_mode) & ~(S_IRWXU | S_IRWXG | S_IRWXO)) == 0
           && rd->rdev == st.st_rdev;
}